

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

void __thiscall CLI::App::~App(App *this)

{
  ~App(this);
  operator_delete(this,800);
  return;
}

Assistant:

virtual ~App() = default;